

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_extension.cpp
# Opt level: O2

bool __thiscall duckdb::DBConfig::HasArrowExtension(DBConfig *this,ArrowExtensionMetadata *info)

{
  pthread_mutex_t *__mutex;
  pointer pAVar1;
  iterator iVar2;
  bool bVar3;
  unordered_map<duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension,_duckdb::HashArrowTypeExtension,_std::equal_to<duckdb::ArrowExtensionMetadata>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>_>
  type_extensions;
  ArrowExtensionMetadata og_info;
  allocator local_f9;
  _Hashtable<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_f8;
  string local_c0 [32];
  ArrowExtensionMetadata local_a0;
  
  __mutex = (pthread_mutex_t *)
            unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
            ::operator->(&this->arrow_extensions);
  ::std::mutex::lock((mutex *)&__mutex->__data);
  pAVar1 = unique_ptr<duckdb::ArrowTypeExtensionSet,_std::default_delete<duckdb::ArrowTypeExtensionSet>,_true>
           ::operator->(&this->arrow_extensions);
  ::std::
  _Hashtable<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_f8,&(pAVar1->type_extensions)._M_h);
  iVar2 = ::std::
          _Hashtable<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&local_f8,info);
  bVar3 = true;
  if (iVar2.
      super__Node_iterator_base<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_false>
      ._M_cur == (__node_type *)0x0) {
    ArrowExtensionMetadata::ArrowExtensionMetadata(&local_a0,info);
    ::std::__cxx11::string::string(local_c0,anon_var_dwarf_4bacfca + 9,&local_f9);
    ::std::__cxx11::string::operator=((string *)&info->arrow_format,local_c0);
    ::std::__cxx11::string::~string(local_c0);
    iVar2 = ::std::
            _Hashtable<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&local_f8,info);
    bVar3 = iVar2.
            super__Node_iterator_base<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_false>
            ._M_cur != (__node_type *)0x0;
    ArrowExtensionMetadata::~ArrowExtensionMetadata(&local_a0);
  }
  ::std::
  _Hashtable<duckdb::ArrowExtensionMetadata,_std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>,_std::allocator<std::pair<const_duckdb::ArrowExtensionMetadata,_duckdb::ArrowTypeExtension>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::ArrowExtensionMetadata>,_duckdb::HashArrowTypeExtension,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_f8);
  pthread_mutex_unlock(__mutex);
  return bVar3;
}

Assistant:

bool DBConfig::HasArrowExtension(ArrowExtensionMetadata info) const {
	lock_guard<mutex> l(arrow_extensions->lock);
	auto type_extensions = arrow_extensions->type_extensions;

	if (type_extensions.find(info) != type_extensions.end()) {
		return true;
	}

	auto og_info = info;
	info.SetArrowFormat("");
	if (type_extensions.find(info) != type_extensions.end()) {
		return true;
	}

	return false;
}